

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O1

void __thiscall
MethodProperty_MoveFrom_Test::~MethodProperty_MoveFrom_Test(MethodProperty_MoveFrom_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, MoveFrom)
{
  MethodMovableType obj;

  // can't move from returned value
  auto remembered_value = obj.m_value1.getId();
  Movable move_to = std::move( obj.value1() );
  EXPECT_NE( remembered_value, move_to.getId() );
  EXPECT_NE( 0, obj.m_value1.getId() );
  
  // can't move from returned value
  remembered_value = obj.m_ro_value.getId();
  Movable move_to4 = std::move( obj.ro_value() );
  EXPECT_NE( remembered_value, move_to4.getId() );
  EXPECT_NE( 0, obj.m_ro_value.getId() );
  
  remembered_value = obj.m_value1.getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_NE( remembered_value, move_to2.getId() );
  EXPECT_NE( 0, obj.m_value1.getId() );
  
  remembered_value = obj.m_ro_value.getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_NE( remembered_value, move_to3.getId() );
  EXPECT_NE( 0, obj.m_ro_value.getId() );
  
  remembered_value = obj.m_value3.id;
  Movable move_to5;
  move_to5 = std::move( obj.value3 );
  EXPECT_EQ( remembered_value, move_to5.getId() );
  EXPECT_NE( 0, obj.m_value3.id );
  
  remembered_value = obj.m_ro_value2.id;
  Movable move_to6;
  move_to6 = std::move( obj.ro_value2 );
  EXPECT_EQ( remembered_value, move_to6.getId() );
  EXPECT_NE( 0, obj.m_ro_value2.id );
}